

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O0

double mp::ComputeValue<mp::VarInfoRecomp>(PLConstraint *con,VarInfoRecomp *x)

{
  double dVar1;
  PLPoints *this;
  const_reference pvVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  int i0;
  double x0;
  PLPoints *plp;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  VarInfoImpl<mp::VarVecRecomp> *in_stack_ffffffffffffff50;
  value_type vVar5;
  PLPoints *in_stack_ffffffffffffff70;
  PLConParams *in_stack_ffffffffffffff80;
  int local_2c;
  value_type local_8;
  
  CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>::GetParameters
            ((CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId> *)
             (in_RDI + 0x28));
  this = PLConParams::GetPLPoints(in_stack_ffffffffffffff80);
  CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId> *)
             (in_RDI + 0x28));
  std::array<int,_1UL>::operator[]
            ((array<int,_1UL> *)in_stack_ffffffffffffff50,
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  dVar3 = VarInfoImpl<mp::VarVecRecomp>::operator[]
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  pvVar2 = std::vector<double,_std::allocator<double>_>::front
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
  if (*pvVar2 <= dVar3) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
    if (dVar3 < *pvVar2 || dVar3 == *pvVar2) {
      local_2c = 0;
      while (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->x_,(long)local_2c), *pvVar2 <= dVar3 && dVar3 != *pvVar2) {
        local_2c = local_2c + 1;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->x_,(long)local_2c);
      if ((*pvVar2 != dVar3) || (NAN(*pvVar2) || NAN(dVar3))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->y_,(long)(local_2c + -1));
        dVar1 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->y_,(long)local_2c);
        vVar5 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->y_,(long)(local_2c + -1));
        dVar4 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->x_,(long)(local_2c + -1));
        dVar4 = (vVar5 - dVar4) * (dVar3 - *pvVar2);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->x_,(long)local_2c);
        dVar3 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->x_,(long)(local_2c + -1));
        local_8 = dVar1 + dVar4 / (dVar3 - *pvVar2);
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->y_,(long)local_2c);
        local_8 = *pvVar2;
      }
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::back
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
      dVar1 = *pvVar2;
      dVar4 = PLPoints::PostSlope((PLPoints *)in_stack_ffffffffffffff80);
      pvVar2 = std::vector<double,_std::allocator<double>_>::back
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
      local_8 = dVar4 * (dVar3 - *pvVar2) + dVar1;
    }
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::front
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
    dVar1 = *pvVar2;
    dVar4 = PLPoints::PreSlope(in_stack_ffffffffffffff70);
    pvVar2 = std::vector<double,_std::allocator<double>_>::front
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
    local_8 = -dVar4 * (*pvVar2 - dVar3) + dVar1;
  }
  return local_8;
}

Assistant:

double ComputeValue(const PLConstraint& con, const VarVec& x) {
  const auto& plp = con.GetParameters().GetPLPoints();
  assert(!plp.empty());
  auto x0 = x[con.GetArguments()[0]];        // position
  if (x0<plp.x_.front())
    return plp.y_.front()
        - plp.PreSlope()*(plp.x_.front() - x0);
  if (x0>plp.x_.back())
    return plp.y_.back()
        + plp.PostSlope()*(x0 - plp.x_.back());
  int i0=0;
  for ( ; x0 > plp.x_[i0]; ++i0) ;
  return plp.x_[i0]==x0
      ? plp.y_[i0]
        : (plp.y_[i0-1]
           + (plp.y_[i0]-plp.y_[i0-1])
        * (x0-plp.x_[i0-1]) / (plp.x_[i0]-plp.x_[i0-1]));
}